

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O3

void __thiscall
math::wide_integer::uintwide_t<48U,_unsigned_char,_void,_false>::eval_divide_by_single_limb
          (uintwide_t<48U,_unsigned_char,_void,_false> *this,limb_type_conflict1 short_denominator,
          unsigned_fast_type u_offset,uintwide_t<48U,_unsigned_char,_void,_false> *remainder)

{
  representation_type *prVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  
  if (u_offset << 0x20 == 0x600000000) {
    uVar4 = 0;
    uVar2 = 0;
  }
  else {
    lVar5 = (long)(0x600000000 - (u_offset << 0x20)) >> 0x20;
    uVar2 = 0;
    uVar4 = 0;
    do {
      uVar3 = (uVar4 - uVar2 * (ushort)short_denominator) * 0x100;
      uVar2 = (uint)(this->values).super_array<unsigned_char,_6UL>.elems[lVar5 + -1];
      uVar4 = uVar3 | uVar2;
      uVar2 = (uVar3 & 0xffff | uVar2) / (uint)(ushort)short_denominator;
      (this->values).super_array<unsigned_char,_6UL>.elems[lVar5 + -1] = (value_type_conflict4)uVar2
      ;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  if (remainder != (uintwide_t<48U,_unsigned_char,_void,_false> *)0x0) {
    (remainder->values).super_array<unsigned_char,_6UL>.elems[0] =
         (char)uVar4 - (char)uVar2 * short_denominator;
    prVar1 = &remainder->values;
    (prVar1->super_array<unsigned_char,_6UL>).elems[1] = '\0';
    (prVar1->super_array<unsigned_char,_6UL>).elems[2] = '\0';
    (prVar1->super_array<unsigned_char,_6UL>).elems[3] = '\0';
    (prVar1->super_array<unsigned_char,_6UL>).elems[4] = '\0';
    (remainder->values).super_array<unsigned_char,_6UL>.elems[5] = '\0';
  }
  return;
}

Assistant:

constexpr auto eval_divide_by_single_limb(const limb_type          short_denominator,
                                              const unsigned_fast_type u_offset,
                                                    uintwide_t*        remainder) -> void
    {
      // The denominator has one single limb.
      // Use a one-dimensional division algorithm.

      auto long_numerator = double_limb_type { };
      auto hi_part        = static_cast<limb_type>(UINT8_C(0));

      {
        reverse_iterator
          ri
          {
            detail::advance_and_point
            (
              values.begin(),
              static_cast<size_t>(number_of_limbs - static_cast<size_t>(u_offset))
            )
          };

        for( ; ri != values.rend(); ++ri) // NOLINT(altera-id-dependent-backward-branch)
        {
          long_numerator =
            static_cast<double_limb_type>
            (
               *ri
             + static_cast<double_limb_type>
               (
                    static_cast<double_limb_type>
                    (
                        long_numerator
                      - static_cast<double_limb_type>(static_cast<double_limb_type>(short_denominator) * hi_part)
                    )
                 << static_cast<unsigned>(std::numeric_limits<limb_type>::digits)
               )
            );

          *ri = detail::make_lo<limb_type>(static_cast<double_limb_type>(long_numerator / short_denominator));

          hi_part = *ri;
        }
      }

      if(remainder != nullptr)
      {
        long_numerator =
          static_cast<double_limb_type>
          (
             static_cast<double_limb_type>(*values.cbegin())
           + static_cast<double_limb_type>
             (
                  static_cast<double_limb_type>
                  (
                    long_numerator - static_cast<double_limb_type>(static_cast<double_limb_type>(short_denominator) * hi_part)
                  )
               << static_cast<unsigned>(std::numeric_limits<limb_type>::digits)
             )
          );

        *remainder =
          static_cast<limb_type>
          (
            long_numerator >> static_cast<unsigned>(std::numeric_limits<limb_type>::digits)
          );
      }
    }